

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glauber.cxx
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  uint uVar3;
  char **argv_00;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar4;
  char *pcVar5;
  typed_value<int,_char> *ptVar6;
  typed_value<std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>,_char>
  *ptVar7;
  typed_value<boost::filesystem::path,_char> *ptVar8;
  typed_value<double,_char> *ptVar9;
  typed_value<long,_char> *ptVar10;
  options_description *poVar11;
  const_iterator cVar12;
  ostream *poVar13;
  any *operand;
  vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *pvVar14;
  logic_error *this;
  long *plVar15;
  pointer pbVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  uint uVar17;
  string usage_str;
  VarMap var_map;
  OptDesc all_opts;
  OptDesc config_file_opts;
  OptDesc usage_opts;
  OptDesc grid_opts;
  Collider collider;
  positional_options_description positional_opts;
  OptDesc phys_opts;
  OptDesc output_opts;
  OptDesc general_opts;
  OptDesc main_opts;
  string local_990;
  uint local_970;
  int local_96c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_968;
  char **local_940;
  long local_938;
  double local_930;
  double local_928;
  double local_920;
  double local_918;
  double local_910;
  double local_908;
  double local_900;
  undefined8 local_8f8;
  undefined1 local_8f0 [24];
  _Rb_tree_node_base local_8d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_8b0 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_880;
  string local_850;
  undefined1 *local_830 [2];
  undefined1 local_820 [16];
  string local_810;
  undefined1 *local_7f0 [2];
  undefined1 local_7e0 [16];
  string local_7d0;
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_7a8 [24];
  void *local_790;
  undefined4 local_788;
  undefined8 local_780;
  undefined4 local_778;
  undefined8 local_770;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_768 [24];
  basic_parsed_options<char> local_750;
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_728 [24];
  void *local_710;
  undefined4 local_708;
  undefined8 local_700;
  undefined4 local_6f8;
  undefined8 local_6f0;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_6e8 [24];
  string local_6d0;
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_6a8 [24];
  void *local_690;
  undefined4 local_688;
  undefined8 local_680;
  undefined4 local_678;
  undefined8 local_670;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_668 [24];
  undefined1 *local_650 [2];
  undefined1 local_640 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_628 [24];
  void *local_610;
  undefined4 local_608;
  undefined8 local_600;
  undefined4 local_5f8;
  undefined8 local_5f0;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_5e8 [24];
  string local_5d0;
  undefined1 *local_5b0 [2];
  undefined1 local_5a0 [16];
  undefined1 *local_590 [2];
  undefined1 local_580 [16];
  string local_570;
  undefined1 local_550 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_540 [2];
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_520 [32];
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_500 [32];
  string *local_4e0;
  unsigned_long local_450 [57];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  undefined1 *local_270;
  undefined1 local_260 [16];
  undefined1 *local_250 [2];
  undefined1 local_240 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_228 [24];
  void *local_210;
  undefined4 local_208;
  undefined8 local_200;
  undefined4 local_1f8;
  undefined8 local_1f0;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_1e8 [24];
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_1a8 [24];
  void *local_190;
  undefined4 local_188;
  undefined8 local_180;
  undefined4 local_178;
  undefined8 local_170;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_168 [24];
  undefined1 *local_150 [2];
  undefined1 local_140 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_128 [24];
  void *local_110;
  undefined4 local_108;
  undefined8 local_100;
  undefined4 local_f8;
  undefined8 local_f0;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_e8 [24];
  function1<void,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  local_d0;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_88 [24];
  void *local_70;
  undefined4 local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_50;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_48 [24];
  
  uVar3 = (uint)boost::program_options::options_description::m_default_line_length;
  uVar17 = (uint)boost::program_options::options_description::m_default_line_length >> 1;
  local_96c = argc;
  boost::program_options::options_description::options_description
            ((options_description *)local_b0,
             (uint)boost::program_options::options_description::m_default_line_length,uVar17);
  local_550._0_8_ = boost::program_options::options_description::add_options();
  ptVar4 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                     ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)0x0);
  ptVar4->m_required = true;
  local_d0.super_function_base.vtable =
       (vtable_base *)
       (boost::
        function1<void,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
        ::assign_to<main::$_0>(main::$_0)::stored_vtable_abi_cxx11_ + 1);
  boost::
  function1<void,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::operator=(&ptVar4->m_notifier,&local_d0);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (local_550,(value_semantic *)"projectile",(char *)ptVar4);
  ptVar6 = boost::program_options::value<int>((int *)0x0);
  local_8f0._0_4_ = 1;
  ptVar6 = boost::program_options::typed_value<int,_char>::default_value(ptVar6,(int *)local_8f0);
  boost::program_options::options_description_easy_init::operator()
            (pcVar5,(value_semantic *)"number-events",(char *)ptVar6);
  boost::
  function1<void,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(&local_d0);
  boost::program_options::positional_options_description::positional_options_description
            ((positional_options_description *)&local_288);
  pcVar5 = (char *)boost::program_options::positional_options_description::add
                             ((char *)&local_288,0x12f040);
  boost::program_options::positional_options_description::add(pcVar5,0x12f05e);
  pbVar16 = (pointer)(local_550 + 0x10);
  local_550._0_8_ = pbVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"general options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_150,(string *)local_550,uVar3,uVar17);
  if ((pointer)local_550._0_8_ != pbVar16) {
    operator_delete((void *)local_550._0_8_);
  }
  local_8f0._0_8_ = boost::program_options::options_description::add_options();
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (local_8f0,"help,h");
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,"version");
  ptVar7 = boost::program_options::
           value<std::vector<boost::filesystem::path,std::allocator<boost::filesystem::path>>>
                     ((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)
                      0x0);
  local_550._0_8_ = pbVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"FILE","");
  std::__cxx11::string::_M_assign((string *)&ptVar7->m_value_name);
  boost::program_options::options_description_easy_init::operator()
            (pcVar5,(value_semantic *)"config-file,c",(char *)ptVar7);
  if ((pointer)local_550._0_8_ != pbVar16) {
    operator_delete((void *)local_550._0_8_);
  }
  local_550._0_8_ = pbVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"output options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_1d0,(string *)local_550,uVar3,uVar17);
  if ((pointer)local_550._0_8_ != pbVar16) {
    operator_delete((void *)local_550._0_8_);
  }
  local_8f0._0_8_ = boost::program_options::options_description::add_options();
  pcVar5 = (char *)boost::program_options::bool_switch();
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (local_8f0,(value_semantic *)"quiet,q",pcVar5);
  ptVar8 = boost::program_options::value<boost::filesystem::path>((path *)0x0);
  local_550._0_8_ = pbVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"PATH","");
  std::__cxx11::string::_M_assign((string *)&ptVar8->m_value_name);
  boost::program_options::options_description_easy_init::operator()
            (pcVar5,(value_semantic *)"output,o",(char *)ptVar8);
  if ((pointer)local_550._0_8_ != pbVar16) {
    operator_delete((void *)local_550._0_8_);
  }
  local_550._0_8_ = pbVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"physical options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_250,(string *)local_550,uVar3,uVar17);
  if ((pointer)local_550._0_8_ != pbVar16) {
    operator_delete((void *)local_550._0_8_);
  }
  local_8f8 = boost::program_options::options_description::add_options();
  ptVar9 = boost::program_options::value<double>((double *)0x0);
  local_550._0_8_ = pbVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"FLOAT","");
  std::__cxx11::string::_M_assign((string *)&ptVar9->m_value_name);
  local_900 = 0.0;
  local_8f0._0_8_ = local_8f0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8f0,"0","");
  ptVar9 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar9,&local_900,(string *)local_8f0);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_8f8,(value_semantic *)"alpha,a",(char *)ptVar9);
  ptVar9 = boost::program_options::value<double>((double *)0x0);
  local_650[0] = local_640;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_650,"FLOAT","");
  local_940 = argv;
  std::__cxx11::string::_M_assign((string *)&ptVar9->m_value_name);
  local_908 = 1.0;
  local_6d0._M_dataplus._M_p = (pointer)&local_6d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d0,"1","");
  ptVar9 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar9,&local_908,&local_6d0);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"fluctuation,k",(char *)ptVar9);
  ptVar9 = boost::program_options::value<double>((double *)0x0);
  local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d0,"FLOAT","");
  std::__cxx11::string::_M_assign((string *)&ptVar9->m_value_name);
  local_910 = 0.5;
  local_750.options.
  super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_750.options.
                        super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"0.5","");
  ptVar9 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar9,&local_910,(string *)&local_750);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"nucleon-width,w",(char *)ptVar9);
  ptVar9 = boost::program_options::value<double>((double *)0x0);
  local_968._M_dataplus._M_p = (pointer)&local_968.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_968,"FLOAT","");
  std::__cxx11::string::_M_assign((string *)&ptVar9->m_value_name);
  local_918 = 6.4;
  local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_990,"6.4","");
  ptVar9 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar9,&local_918,&local_990);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"cross-section,x",(char *)ptVar9);
  ptVar9 = boost::program_options::value<double>((double *)0x0);
  local_7f0[0] = local_7e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7f0,"FLOAT","");
  local_970 = uVar17;
  std::__cxx11::string::_M_assign((string *)&ptVar9->m_value_name);
  local_920 = 1.0;
  local_810._M_dataplus._M_p = (pointer)&local_810.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_810,"1","");
  ptVar9 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar9,&local_920,&local_810);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"normalization,n",(char *)ptVar9);
  ptVar9 = boost::program_options::value<double>((double *)0x0);
  local_830[0] = local_820;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_830,"FLOAT","");
  std::__cxx11::string::_M_assign((string *)&ptVar9->m_value_name);
  local_928 = 0.0;
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"0","");
  ptVar9 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar9,&local_928,&local_570);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"b-min",(char *)ptVar9);
  ptVar9 = boost::program_options::value<double>((double *)0x0);
  local_590[0] = local_580;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_590,"FLOAT","");
  std::__cxx11::string::_M_assign((string *)&ptVar9->m_value_name);
  local_930 = -1.0;
  local_850._M_dataplus._M_p = (pointer)&local_850.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_850,"auto","");
  ptVar9 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar9,&local_930,&local_850);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             (pcVar5,(value_semantic *)"b-max",(char *)ptVar9);
  ptVar10 = boost::program_options::value<long>((long *)0x0);
  local_5b0[0] = local_5a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_5b0,"INT","");
  std::__cxx11::string::_M_assign((string *)&ptVar10->m_value_name);
  local_938 = -1;
  local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d0,"auto","");
  ptVar10 = boost::program_options::typed_value<long,_char>::default_value
                      (ptVar10,&local_938,&local_5d0);
  boost::program_options::options_description_easy_init::operator()
            (pcVar5,(value_semantic *)"random-seed",(char *)ptVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
    operator_delete(local_5d0._M_dataplus._M_p);
  }
  argv_00 = local_940;
  if (local_5b0[0] != local_5a0) {
    operator_delete(local_5b0[0]);
  }
  paVar1 = &local_6d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_850._M_dataplus._M_p != &local_850.field_2) {
    operator_delete(local_850._M_dataplus._M_p);
  }
  pbVar16 = (pointer)(local_550 + 0x10);
  if (local_590[0] != local_580) {
    operator_delete(local_590[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p);
  }
  if (local_830[0] != local_820) {
    operator_delete(local_830[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_810._M_dataplus._M_p != &local_810.field_2) {
    operator_delete(local_810._M_dataplus._M_p);
  }
  uVar17 = local_970;
  if (local_7f0[0] != local_7e0) {
    operator_delete(local_7f0[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990._M_dataplus._M_p != &local_990.field_2) {
    operator_delete(local_990._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968._M_dataplus._M_p != &local_968.field_2) {
    operator_delete(local_968._M_dataplus._M_p);
  }
  if (local_750.options.
      super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_750.options.
                       super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
               + 0x10U)) {
    operator_delete(local_750.options.
                    super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
    operator_delete(local_7d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_6d0._M_dataplus._M_p);
  }
  if (local_650[0] != local_640) {
    operator_delete(local_650[0]);
  }
  if ((undefined1 *)local_8f0._0_8_ != local_8f0 + 0x10) {
    operator_delete((void *)local_8f0._0_8_);
  }
  if ((pointer)local_550._0_8_ != pbVar16) {
    operator_delete((void *)local_550._0_8_);
  }
  local_550._0_8_ = pbVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"grid options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_650,(string *)local_550,uVar3,uVar17);
  if ((pointer)local_550._0_8_ != pbVar16) {
    operator_delete((void *)local_550._0_8_);
  }
  local_750.options.
  super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)boost::program_options::options_description::add_options();
  ptVar9 = boost::program_options::value<double>((double *)0x0);
  local_550._0_8_ = pbVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"FLOAT","");
  std::__cxx11::string::_M_assign((string *)&ptVar9->m_value_name);
  local_968._M_dataplus._M_p = (pointer)0x4024000000000000;
  local_8f0._0_8_ = local_8f0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8f0,"10.0","");
  ptVar9 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar9,(double *)&local_968,(string *)local_8f0);
  pcVar5 = (char *)boost::program_options::options_description_easy_init::operator()
                             ((char *)&local_750,(value_semantic *)"grid-max",(char *)ptVar9);
  ptVar9 = boost::program_options::value<double>((double *)0x0);
  local_6d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d0,"FLOAT","");
  std::__cxx11::string::_M_assign((string *)&ptVar9->m_value_name);
  local_990._M_dataplus._M_p = (pointer)0x3fc999999999999a;
  local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d0,"0.2","");
  ptVar9 = boost::program_options::typed_value<double,_char>::default_value
                     (ptVar9,(double *)&local_990,&local_7d0);
  boost::program_options::options_description_easy_init::operator()
            (pcVar5,(value_semantic *)"grid-step",(char *)ptVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
    operator_delete(local_7d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_6d0._M_dataplus._M_p);
  }
  if ((undefined1 *)local_8f0._0_8_ != local_8f0 + 0x10) {
    operator_delete((void *)local_8f0._0_8_);
  }
  if ((pointer)local_550._0_8_ != pbVar16) {
    operator_delete((void *)local_550._0_8_);
  }
  boost::program_options::options_description::options_description
            ((options_description *)&local_6d0,uVar3,uVar17);
  poVar11 = (options_description *)
            boost::program_options::options_description::add((options_description *)&local_6d0);
  poVar11 = (options_description *)boost::program_options::options_description::add(poVar11);
  poVar11 = (options_description *)boost::program_options::options_description::add(poVar11);
  boost::program_options::options_description::add(poVar11);
  boost::program_options::options_description::options_description
            ((options_description *)&local_7d0,uVar3,uVar17);
  poVar11 = (options_description *)
            boost::program_options::options_description::add((options_description *)&local_7d0);
  boost::program_options::options_description::add(poVar11);
  local_990._M_dataplus._M_p = (pointer)&local_990.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_990,
             "usage: glauber [options] projectile projectile [number-events = 1]\n","");
  boost::program_options::variables_map::variables_map((variables_map *)local_8f0);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)local_550,local_96c,argv_00);
  boost::program_options::detail::cmdline::set_options_description((options_description *)local_550)
  ;
  local_4e0 = &local_7d0;
  boost::program_options::detail::cmdline::set_positional_options
            ((positional_options_description *)local_550);
  boost::program_options::basic_command_line_parser<char>::run
            (&local_750,(basic_command_line_parser<char> *)local_550);
  boost::program_options::store((basic_parsed_options *)&local_750,(variables_map *)local_8f0,false)
  ;
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&local_750.options);
  boost::
  function1<std::vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  ::~function1(local_500);
  boost::
  function1<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  ::~function1(local_520);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_550);
  local_550._0_8_ = pbVar16;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"help","");
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                   *)(local_8f0 + 0x10),(key_type *)local_550);
  if ((pointer)local_550._0_8_ != pbVar16) {
    operator_delete((void *)local_550._0_8_);
  }
  if (cVar12._M_node == &local_8d8) {
    local_550._0_8_ = pbVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"version","");
    cVar12 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                     *)(local_8f0 + 0x10),(key_type *)local_550);
    if ((pointer)local_550._0_8_ != pbVar16) {
      operator_delete((void *)local_550._0_8_);
    }
    if (cVar12._M_node == &local_8d8) {
      local_550._0_8_ = pbVar16;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"config-file","");
      cVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                       *)(local_8f0 + 0x10),(key_type *)local_550);
      if ((pointer)local_550._0_8_ != pbVar16) {
        operator_delete((void *)local_550._0_8_);
      }
      if (cVar12._M_node != &local_8d8) {
        boost::program_options::options_description::options_description
                  ((options_description *)&local_750,uVar3,uVar17);
        poVar11 = (options_description *)
                  boost::program_options::options_description::add
                            ((options_description *)&local_750);
        poVar11 = (options_description *)boost::program_options::options_description::add(poVar11);
        poVar11 = (options_description *)boost::program_options::options_description::add(poVar11);
        boost::program_options::options_description::add(poVar11);
        local_550._0_8_ = pbVar16;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"config-file","");
        operand = (any *)boost::program_options::abstract_variables_map::operator[]
                                   ((string *)local_8f0);
        pvVar14 = boost::
                  any_cast<std::vector<boost::filesystem::path,std::allocator<boost::filesystem::path>>const&>
                            (operand);
        if ((pointer)local_550._0_8_ != pbVar16) {
          operator_delete((void *)local_550._0_8_);
        }
        __rhs = &((pvVar14->
                  super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                  )._M_impl.super__Vector_impl_data._M_start)->m_pathname;
        pbVar2 = &((pvVar14->
                   super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                   )._M_impl.super__Vector_impl_data._M_finish)->m_pathname;
        if (__rhs != pbVar2) {
          do {
            boost::filesystem::detail::status((path *)local_550,(error_code *)__rhs);
            if ((uint)local_550._0_4_ < 2) {
              this = (logic_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_968,"configuration file \'",__rhs);
              plVar15 = (long *)std::__cxx11::string::append((char *)&local_968);
              local_550._0_8_ = *plVar15;
              pbVar16 = (pointer)(plVar15 + 2);
              if ((pointer)local_550._0_8_ == pbVar16) {
                local_540[0]._0_8_ = (pbVar16->_M_dataplus)._M_p;
                local_540[0]._8_8_ = plVar15[3];
                local_550._0_8_ = (pointer)(local_550 + 0x10);
              }
              else {
                local_540[0]._0_8_ = (pbVar16->_M_dataplus)._M_p;
              }
              local_550._8_8_ =
                   ((_Tuple_impl<0UL,_glauber::Nucleus_*,_std::default_delete<glauber::Nucleus>_> *)
                   (plVar15 + 1))->super__Head_base<0UL,_glauber::Nucleus_*,_false>;
              *plVar15 = (long)pbVar16;
              plVar15[1] = 0;
              *(undefined1 *)(plVar15 + 2) = 0;
              std::logic_error::logic_error(this,(string *)local_550);
              *(undefined ***)this = &PTR__logic_error_0013a7e0;
              __cxa_throw(this,&boost::program_options::error::typeinfo,
                          std::logic_error::~logic_error);
            }
            boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
                      ((basic_ifstream<char,_std::char_traits<char>_> *)local_550,(path *)__rhs);
            boost::program_options::parse_config_file<char>
                      ((istream *)&local_968,(options_description *)local_550,SUB81(&local_750,0));
            boost::program_options::store
                      ((basic_parsed_options *)&local_968,(variables_map *)local_8f0,false);
            std::
            vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
            ::~vector((vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                       *)&local_968);
            local_550._0_8_ =
                 std::ifstream-in-boost::filesystem::basic_ifstream<char,std::char_traits<char>>::
                 construction_vtable + 0x18;
            local_450[0] = 0x13a8b8;
            std::filebuf::~filebuf((filebuf *)(local_550 + 0x10));
            local_550._0_8_ =
                 std::istream-in-boost::filesystem::basic_ifstream<char,std::char_traits<char>>::
                 construction_vtable + 0x18;
            local_450[0] = 0x13a908;
            local_550._8_8_ =
                 (_Tuple_impl<0UL,_glauber::Nucleus_*,_std::default_delete<glauber::Nucleus>_>)0x0;
            std::ios_base::~ios_base((ios_base *)local_450);
            __rhs = __rhs + 1;
          } while (__rhs != pbVar2);
        }
        std::
        vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
        ::~vector(local_6e8);
        if (local_710 != (void *)0x0) {
          operator_delete(local_710);
          local_710 = (void *)0x0;
          local_708 = 0;
          local_700 = 0;
          local_6f8 = 0;
          local_6f0 = 0;
        }
        std::
        vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
        ::~vector(local_728);
        if (local_750.options.
            super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)((long)&local_750.options.
                             super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                     + 0x10U)) {
          operator_delete(local_750.options.
                          super__Vector_base<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      boost::program_options::notify((variables_map *)local_8f0);
      glauber::Collider::Collider((Collider *)local_550,(VarMap *)local_8f0);
      glauber::Collider::run_events((Collider *)local_550);
      glauber::Collider::~Collider((Collider *)local_550);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"glauber ",8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"1.0.0",5);
      local_550[0] = 10;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_550,1);
    }
  }
  else {
    poVar13 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_990._M_dataplus._M_p,local_990._M_string_length
                        );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nprojectile = { p | d | Cu | Cu2 | Au | Au2 | Pb | U | U2 | U3 }\n",0x41);
    poVar13 = (ostream *)
              boost::program_options::operator<<(poVar13,(options_description *)&local_6d0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\nsee the online documentation for complete usage information\n",0x3d);
  }
  local_8f0._0_8_ = powl;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_880);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(local_8b0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
               *)(local_8f0 + 0x10));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990._M_dataplus._M_p != &local_990.field_2) {
    operator_delete(local_990._M_dataplus._M_p);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_768);
  if (local_790 != (void *)0x0) {
    operator_delete(local_790);
    local_790 = (void *)0x0;
    local_788 = 0;
    local_780 = 0;
    local_778 = 0;
    local_770 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_7a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
    operator_delete(local_7d0._M_dataplus._M_p);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_668);
  if (local_690 != (void *)0x0) {
    operator_delete(local_690);
    local_690 = (void *)0x0;
    local_688 = 0;
    local_680 = 0;
    local_678 = 0;
    local_670 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_6a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d0._M_dataplus._M_p != &local_6d0.field_2) {
    operator_delete(local_6d0._M_dataplus._M_p);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_5e8);
  if (local_610 != (void *)0x0) {
    operator_delete(local_610);
    local_610 = (void *)0x0;
    local_608 = 0;
    local_600 = 0;
    local_5f8 = 0;
    local_5f0 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_628);
  if (local_650[0] != local_640) {
    operator_delete(local_650[0]);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_1e8);
  if (local_210 != (void *)0x0) {
    operator_delete(local_210);
    local_210 = (void *)0x0;
    local_208 = 0;
    local_200 = 0;
    local_1f8 = 0;
    local_1f0 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_228);
  if (local_250[0] != local_240) {
    operator_delete(local_250[0]);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_168);
  if (local_190 != (void *)0x0) {
    operator_delete(local_190);
    local_190 = (void *)0x0;
    local_188 = 0;
    local_180 = 0;
    local_178 = 0;
    local_170 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_1a8);
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0]);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_e8);
  if (local_110 != (void *)0x0) {
    operator_delete(local_110);
    local_110 = (void *)0x0;
    local_108 = 0;
    local_100 = 0;
    local_f8 = 0;
    local_f0 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_128);
  if (local_150[0] != local_140) {
    operator_delete(local_150[0]);
  }
  if (local_270 != local_260) {
    operator_delete(local_270);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288);
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_48);
  if (local_70 != (void *)0x0) {
    operator_delete(local_70);
    local_70 = (void *)0x0;
    local_68 = 0;
    local_60 = 0;
    local_58 = 0;
    local_50 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_88);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  using namespace glauber;

  // Parse options with boost::program_options.
  // There are quite a few options, so let's separate them into logical groups.
  using OptDesc = po::options_description;

  using VecStr = std::vector<std::string>;
  OptDesc main_opts{};
  main_opts.add_options()
    ("projectile", po::value<VecStr>()->required()->
     notifier(  // use a lambda to verify there are exactly two projectiles
         [](const VecStr& projectiles) {
           if (projectiles.size() != 2)
            throw po::required_option{"projectile"};
           }),
     "projectile symbols")
    ("number-events", po::value<int>()->default_value(1),
     "number of events");

  // Make all main arguments positional.
  po::positional_options_description positional_opts{};
  positional_opts
    .add("projectile", 2)
    .add("number-events", 1);

  using VecPath = std::vector<fs::path>;
  OptDesc general_opts{"general options"};
  general_opts.add_options()
    ("help,h", "show this help message and exit")
    ("version", "print version information and exit")
    ("config-file,c", po::value<VecPath>()->value_name("FILE"),
     "configuration file\n(can be passed multiple times)");

  OptDesc output_opts{"output options"};
  output_opts.add_options()
    ("quiet,q", po::bool_switch(),
     "do not print event properties to stdout")
    ("output,o", po::value<fs::path>()->value_name("PATH"),
     "HDF5 file or directory for text files");

  OptDesc phys_opts{"physical options"};
  phys_opts.add_options()
    ("alpha,a",
     po::value<double>()->value_name("FLOAT")->default_value(0., "0"),
     "binary collision fraction")
    ("fluctuation,k",
     po::value<double>()->value_name("FLOAT")->default_value(1., "1"),
     "gamma fluctuation shape parameter")
    // ("beam-energy,e",
    //  po::value<double>()->value_name("FLOAT")->default_value(2760., "2760"),
    //  "beam energy sqrt(s) [GeV]")
    ("nucleon-width,w",
     po::value<double>()->value_name("FLOAT")->default_value(.5, "0.5"),
     "Gaussian nucleon width [fm]")
    ("cross-section,x",
     po::value<double>()->value_name("FLOAT")->default_value(6.4, "6.4"),
     "inelastic nucleon-nucleon cross section sigma_NN [fm^2]")
    ("normalization,n",
     po::value<double>()->value_name("FLOAT")->default_value(1., "1"),
     "normalization factor")
    ("b-min",
     po::value<double>()->value_name("FLOAT")->default_value(0., "0"),
     "minimum impact parameter [fm]")
    ("b-max",
     po::value<double>()->value_name("FLOAT")->default_value(-1., "auto"),
     "maximum impact parameter [fm]")
    ("random-seed",
     po::value<int64_t>()->value_name("INT")->default_value(-1, "auto"),
     "random seed");

  OptDesc grid_opts{"grid options"};
  grid_opts.add_options()
    ("grid-max",
     po::value<double>()->value_name("FLOAT")->default_value(10., "10.0"),
     "xy max [fm]\n(grid extends from -max to +max)")
    ("grid-step",
     po::value<double>()->value_name("FLOAT")->default_value(0.2, "0.2"),
     "step size [fm]");

  // Make a meta-group containing all the option groups except the main
  // positional options (don't want the auto-generated usage info for those).
  OptDesc usage_opts{};
  usage_opts
    .add(general_opts)
    .add(output_opts)
    .add(phys_opts)
    .add(grid_opts);

  // Now a meta-group containing _all_ options.
  OptDesc all_opts{};
  all_opts
    .add(usage_opts)
    .add(main_opts);

  // Will be used several times.
  const std::string usage_str{
    "usage: glauber [options] projectile projectile [number-events = 1]\n"};

  try {
    // Initialize a VarMap (boost::program_options::variables_map).
    // It will contain all configuration values.
    VarMap var_map{};

    // Parse command line options.
    po::store(po::command_line_parser(argc, argv)
        .options(all_opts).positional(positional_opts).run(), var_map);

    // Handle options that imply immediate exit.
    // Must do this _before_ po::notify() since that can throw exceptions.
    if (var_map.count("help")) {
      std::cout
        << usage_str
        << "\n"
           "projectile = { p | d | Cu | Cu2 | Au | Au2 | Pb | U | U2 | U3 }\n"
        << usage_opts
        << "\n"
           "see the online documentation for complete usage information\n";
      return 0;
    }
    if (var_map.count("version")) {
      std::cout << "glauber " << GLAUBER_VERSION_STRING << '\n';
      return 0;
    }

    // Merge any config files.
    if (var_map.count("config-file")) {
      // Everything except general_opts.
      OptDesc config_file_opts{};
      config_file_opts
        .add(main_opts)
        .add(output_opts)
        .add(phys_opts)
        .add(grid_opts);

      for (const auto& path : var_map["config-file"].as<VecPath>()) {
        if (!fs::exists(path)) {
          throw po::error{
            "configuration file '" + path.string() + "' not found"};
        }
        fs::ifstream ifs{path};
        po::store(po::parse_config_file(ifs, config_file_opts), var_map);
      }
    }

    // Save all the final values into var_map.
    // Exceptions may occur here.
    po::notify(var_map);

    // Go!
    Collider collider{var_map};
    collider.run_events();
  }
  catch (const po::required_option&) {
    // Handle this exception separately from others.
    // This occurs e.g. when the program is excuted with no arguments.
    std::cerr << usage_str << "run 'glauber --help' for more information\n";
    return 1;
  }
  catch (const std::exception& e) {
    // For all other exceptions just output the error message.
    std::cerr << e.what() << '\n';
    return 1;
  }

  return 0;
}